

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::FErrorFunc::checkArguments
          (FErrorFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *diag;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,2);
  if (bVar2) {
    bVar2 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
    if (!bVar2) {
      pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
      return pTVar3;
    }
    pTVar3 = (args->_M_ptr[1]->type).ptr;
    bVar2 = Type::canBeStringLike(pTVar3);
    if (bVar2) {
      return pCVar1->integerType;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,args->_M_ptr[1]->sourceRange);
    ast::operator<<(diag,pTVar3);
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 2))
            return comp.getErrorType();

        if (!args[0]->type->isIntegral())
            return badArg(context, *args[0]);

        const Type& ft = *args[1]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[1]->sourceRange) << ft;
            return comp.getErrorType();
        }

        return comp.getIntegerType();
    }